

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::java::WriteMethodDocComment
               (Printer *printer,MethodDescriptor *method)

{
  MethodDescriptor *this;
  string local_78;
  string local_58;
  string local_38;
  MethodDescriptor *local_18;
  MethodDescriptor *method_local;
  Printer *printer_local;
  
  local_18 = method;
  method_local = (MethodDescriptor *)printer;
  io::Printer::Print<>(printer,"/**\n");
  WriteDocCommentBody<google::protobuf::MethodDescriptor>((Printer *)method_local,local_18);
  this = method_local;
  MethodDescriptor::DebugString_abi_cxx11_(&local_78,local_18);
  FirstLineOf(&local_58,&local_78);
  EscapeJavadoc(&local_38,&local_58);
  io::Printer::Print<char[4],std::__cxx11::string>
            ((Printer *)this," * <code>$def$</code>\n */\n",(char (*) [4])0x7c6934,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void WriteMethodDocComment(io::Printer* printer,
                           const MethodDescriptor* method) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, method);
  printer->Print(
      " * <code>$def$</code>\n"
      " */\n",
      "def", EscapeJavadoc(FirstLineOf(method->DebugString())));
}